

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::Literal(Literal *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  bool local_32;
  byte local_31;
  HeapType local_20;
  Literal *local_18;
  Literal *this_local;
  Type type_local;
  
  (this->type).id = type.id;
  local_18 = this;
  this_local = (Literal *)type.id;
  bVar1 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic((Type *)&this_local);
    switch(BVar2) {
    case none:
    case unreachable:
      handle_unreachable("Invalid literal type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x32);
    case i32:
    case f32:
      (this->field_0).i32 = 0;
      break;
    case i64:
    case f64:
      (this->field_0).i64 = 0;
      break;
    case v128:
      memset(this,0,0x10);
      break;
    default:
      goto switchD_0254f105_default;
    }
  }
  else {
switchD_0254f105_default:
    bVar1 = wasm::Type::isNull((Type *)&this_local);
    if (bVar1) {
      bVar1 = wasm::Type::isNullable((Type *)&this_local);
      local_31 = 0;
      if (bVar1) {
        bVar1 = wasm::Type::isExact((Type *)&this_local);
        local_31 = bVar1 ^ 0xff;
      }
      if ((local_31 & 1) == 0) {
        __assert_fail("type.isNullable() && !type.isExact()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,0x38,"wasm::Literal::Literal(Type)");
      }
      std::shared_ptr<wasm::GCData>::shared_ptr((shared_ptr<wasm::GCData> *)this);
    }
    else {
      bVar1 = wasm::Type::isRef((Type *)&this_local);
      local_32 = false;
      if (bVar1) {
        local_20 = wasm::Type::getHeapType((Type *)&this_local);
        local_32 = HeapType::isMaybeShared(&local_20,i31);
      }
      if (local_32 == false) {
        handle_unreachable("Unexpected literal type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                           ,0x43);
      }
      bVar1 = wasm::Type::isNonNullable((Type *)&this_local);
      if (!bVar1) {
        __assert_fail("type.isNonNullable()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,0x3e,"wasm::Literal::Literal(Type)");
      }
      (this->field_0).i32 = 0;
    }
  }
  return;
}

Assistant:

Literal::Literal(Type type) : type(type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        i32 = 0;
        return;
      case Type::i64:
      case Type::f64:
        i64 = 0;
        return;
      case Type::v128:
        memset(&v128, 0, 16);
        return;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("Invalid literal type");
        return;
    }
  }

  if (type.isNull()) {
    assert(type.isNullable() && !type.isExact());
    new (&gcData) std::shared_ptr<GCData>();
    return;
  }

  if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
    assert(type.isNonNullable());
    i32 = 0;
    return;
  }

  WASM_UNREACHABLE("Unexpected literal type");
}